

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_wrap.c
# Opt level: O1

int aes_crypt_xts_wrap(void *ctx,mbedtls_operation_t operation,size_t length,uchar *data_unit,
                      uchar *input,uchar *output)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  mbedtls_aes_xts_context *xts_ctx;
  uchar *puVar7;
  ulong uVar8;
  bool bVar9;
  byte abStack_68 [16];
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  if (1 < (uint)operation) {
    return -0x6100;
  }
  iVar1 = -0x22;
  if ((0xffffffffff00000e < length - 0x1000001) &&
     (iVar1 = mbedtls_aes_crypt_ecb
                        ((mbedtls_aes_context *)((long)ctx + 0x120),1,data_unit,(uchar *)&uStack_58)
     , iVar1 == 0)) {
    uVar8 = (ulong)((uint)length & 0xf);
    uVar6 = length >> 4;
    iVar1 = 0;
    while( true ) {
      bVar9 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar9) break;
      if (uVar6 == 0 && (operation == MBEDTLS_DECRYPT && uVar8 != 0)) {
        uStack_48 = uStack_58;
        uStack_40 = uStack_50;
        mbedtls_gf128mul_x_ble((uchar *)&uStack_58,(uchar *)&uStack_58);
      }
      lVar3 = 0;
      do {
        abStack_68[lVar3] = *(byte *)((long)&uStack_58 + lVar3) ^ input[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      iVar2 = mbedtls_aes_crypt_ecb((mbedtls_aes_context *)ctx,operation,abStack_68,abStack_68);
      iVar5 = iVar2;
      if (iVar2 == 0) {
        lVar3 = 0;
        do {
          output[lVar3] = *(byte *)((long)&uStack_58 + lVar3) ^ abStack_68[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x10);
        mbedtls_gf128mul_x_ble((uchar *)&uStack_58,(uchar *)&uStack_58);
        output = output + 0x10;
        input = input + 0x10;
        iVar5 = iVar1;
      }
      iVar1 = iVar5;
      if (iVar2 != 0) {
        return iVar1;
      }
    }
    if (uVar8 != 0) {
      puVar7 = (uchar *)&uStack_58;
      if (operation == MBEDTLS_DECRYPT) {
        puVar7 = (uchar *)&uStack_48;
      }
      uVar6 = 0;
      do {
        uVar4 = uVar6;
        output[uVar4] = output[uVar4 - 0x10];
        abStack_68[uVar4] = puVar7[uVar4] ^ input[uVar4];
        uVar6 = uVar4 + 1;
      } while (uVar8 != uVar6);
      if (uVar4 < 0xf) {
        uVar8 = uVar8 | 0xfffffffffffffff0;
        do {
          abStack_68[uVar6] = puVar7[uVar6] ^ output[uVar6 - 0x10];
          uVar6 = uVar6 + 1;
          uVar8 = uVar8 + 1;
        } while (uVar8 != 0);
      }
      iVar2 = mbedtls_aes_crypt_ecb((mbedtls_aes_context *)ctx,operation,abStack_68,abStack_68);
      iVar5 = iVar2;
      if (iVar2 == 0) {
        lVar3 = 0;
        do {
          output[lVar3 + -0x10] = puVar7[lVar3] ^ abStack_68[lVar3];
          lVar3 = lVar3 + 1;
          iVar5 = iVar1;
        } while (lVar3 != 0x10);
      }
      if (iVar2 != 0) {
        return iVar5;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int aes_crypt_xts_wrap( void *ctx, mbedtls_operation_t operation,
                               size_t length,
                               const unsigned char data_unit[16],
                               const unsigned char *input,
                               unsigned char *output )
{
    mbedtls_aes_xts_context *xts_ctx = ctx;
    int mode;

    switch( operation )
    {
        case MBEDTLS_ENCRYPT:
            mode = MBEDTLS_AES_ENCRYPT;
            break;
        case MBEDTLS_DECRYPT:
            mode = MBEDTLS_AES_DECRYPT;
            break;
        default:
            return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    return mbedtls_aes_crypt_xts( xts_ctx, mode, length,
                                  data_unit, input, output );
}